

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

void wallet::ApproximateBestSubset
               (FastRandomContext *insecure_rand,
               vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
               CAmount *nTotalLower,CAmount *nTargetValue,
               vector<char,_std::allocator<char>_> *vfBest,CAmount *nBest,int max_selection_weight,
               int iterations)

{
  pointer pOVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  uint64_t uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  vector<char,_std::allocator<char>_> vfIncluded;
  value_type local_59;
  vector<char,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_59 = '\x01';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign
            (vfBest,((long)(groups->
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(groups->
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5,
             &local_59);
  *nBest = *nTotalLower;
  iVar7 = 0;
  do {
    if (*nBest == *nTargetValue) break;
    local_59 = '\0';
    std::vector<char,_std::allocator<char>_>::_M_fill_assign
              (&local_58,
               ((long)(groups->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(groups->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5,&local_59
              );
    bVar3 = false;
    bVar4 = false;
    iVar8 = 0;
    lVar9 = 0;
    do {
      if ((groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
          _M_impl.super__Vector_impl_data._M_finish !=
          (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        uVar6 = 0;
        uVar10 = 1;
        do {
          if (bVar3) {
            if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6] == '\0') {
LAB_00b8179c:
              pOVar1 = (groups->
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar9 = lVar9 + *(long *)((long)&pOVar1[uVar6].m_value +
                                       (ulong)((pOVar1[uVar6].m_subtract_fee_outputs ^ 1) << 5));
              iVar8 = iVar8 + pOVar1[uVar6].m_weight;
              local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] = '\x01';
              if ((*nTargetValue <= lVar9) && (iVar8 <= max_selection_weight)) {
                if (lVar9 < *nBest) {
                  *nBest = lVar9;
                  std::vector<char,_std::allocator<char>_>::operator=(vfBest,&local_58);
                }
                pOVar1 = (groups->
                         super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                lVar9 = lVar9 - *(long *)((long)&pOVar1[uVar6].m_value +
                                         (ulong)((pOVar1[uVar6].m_subtract_fee_outputs ^ 1) << 5));
                iVar8 = iVar8 - pOVar1[uVar6].m_weight;
                local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6] = '\0';
                bVar4 = true;
              }
            }
          }
          else {
            uVar5 = RandomMixin<FastRandomContext>::randbits<1>
                              (&insecure_rand->super_RandomMixin<FastRandomContext>);
            if (uVar5 != 0) goto LAB_00b8179c;
          }
          uVar6 = ((long)(groups->
                         super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(groups->
                         super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
          bVar11 = uVar10 <= uVar6;
          lVar2 = uVar6 - uVar10;
          uVar6 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar11 && lVar2 != 0);
      }
    } while ((!bVar3) && (bVar3 = true, !bVar4));
    iVar7 = iVar7 + 1;
  } while (iVar7 != 1000);
  if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void ApproximateBestSubset(FastRandomContext& insecure_rand, const std::vector<OutputGroup>& groups,
                                  const CAmount& nTotalLower, const CAmount& nTargetValue,
                                  std::vector<char>& vfBest, CAmount& nBest, int max_selection_weight, int iterations = 1000)
{
    std::vector<char> vfIncluded;

    // Worst case "best" approximation is just all of the groups.
    vfBest.assign(groups.size(), true);
    nBest = nTotalLower;

    for (int nRep = 0; nRep < iterations && nBest != nTargetValue; nRep++)
    {
        vfIncluded.assign(groups.size(), false);
        CAmount nTotal = 0;
        int selected_coins_weight{0};
        bool fReachedTarget = false;
        for (int nPass = 0; nPass < 2 && !fReachedTarget; nPass++)
        {
            for (unsigned int i = 0; i < groups.size(); i++)
            {
                //The solver here uses a randomized algorithm,
                //the randomness serves no real security purpose but is just
                //needed to prevent degenerate behavior and it is important
                //that the rng is fast. We do not use a constant random sequence,
                //because there may be some privacy improvement by making
                //the selection random.
                if (nPass == 0 ? insecure_rand.randbool() : !vfIncluded[i])
                {
                    nTotal += groups[i].GetSelectionAmount();
                    selected_coins_weight += groups[i].m_weight;
                    vfIncluded[i] = true;
                    if (nTotal >= nTargetValue && selected_coins_weight <= max_selection_weight) {
                        fReachedTarget = true;
                        // If the total is between nTargetValue and nBest, it's our new best
                        // approximation.
                        if (nTotal < nBest)
                        {
                            nBest = nTotal;
                            vfBest = vfIncluded;
                        }
                        nTotal -= groups[i].GetSelectionAmount();
                        selected_coins_weight -= groups[i].m_weight;
                        vfIncluded[i] = false;
                    }
                }
            }
        }
    }
}